

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::cpp::CppGenerator::Generate
          (CppGenerator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GeneratorContext *pGVar2;
  FileDescriptor *file_00;
  int iVar3;
  string *psVar4;
  ZeroCopyOutputStream *pZVar5;
  ZeroCopyOutputStream *pZVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  AnnotationCollector *pAVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  string info_path;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string basename;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  Printer printer;
  GeneratedCodeInfo annotations;
  FileGenerator file_generator;
  long *local_3f8;
  long local_3f0;
  long local_3e8 [2];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3d8;
  string local_3c0;
  string local_3a0;
  AnnotationCollector local_380;
  GeneratedCodeInfo *local_378;
  Printer local_370;
  undefined1 local_2e8 [40];
  _Alloc_hider local_2c0;
  size_type local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  string *local_280;
  GeneratorContext *local_278;
  FileDescriptor *local_270;
  GeneratedCodeInfo local_268;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [31];
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  local_3d8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_280 = error;
  local_278 = generator_context;
  local_270 = file;
  ParseGeneratorParameter(parameter,&local_3d8);
  local_2e8._0_8_ = local_2e8 + 0x10;
  local_2e8._8_8_ = 0;
  local_2e8[0x10] = '\0';
  local_2e8[0x20] = false;
  local_2e8[0x21] = false;
  local_2e8[0x22] = true;
  local_2e8[0x23] = false;
  local_2e8[0x24] = false;
  local_2e8[0x25] = false;
  local_2c0._M_p = (pointer)&local_2b0;
  local_2b8 = 0;
  local_2b0._M_local_buf[0] = '\0';
  local_2a0._M_p = (pointer)&local_290;
  local_298 = 0;
  local_290._M_local_buf[0] = '\0';
  if (local_3d8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_3d8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
LAB_0020c852:
    file_00 = local_270;
    StripProto(&local_3a0,*(string **)local_270);
    FileGenerator::FileGenerator((FileGenerator *)local_238,file_00,(Options *)local_2e8);
    pGVar2 = local_278;
    lVar10 = (long)&local_370 + 0x10;
    if ((bool)local_2e8[0x21] == true) {
      local_370._0_8_ = lVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_370,local_3a0._M_dataplus._M_p,
                 local_3a0._M_dataplus._M_p + local_3a0._M_string_length);
      std::__cxx11::string::append(&local_370.variable_delimiter_);
      iVar3 = (*pGVar2->_vptr_GeneratorContext[2])(pGVar2,&local_370);
      pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar3);
      if (local_370._0_8_ != lVar10) {
        operator_delete((void *)local_370._0_8_,(ulong)(local_370.buffer_ + 1));
      }
      GeneratedCodeInfo::GeneratedCodeInfo(&local_268);
      local_380._vptr_AnnotationCollector = (_func_int **)&PTR_AddAnnotation_0041ee28;
      local_3f8 = local_3e8;
      local_378 = &local_268;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3f8,local_3a0._M_dataplus._M_p,
                 local_3a0._M_dataplus._M_p + local_3a0._M_string_length);
      std::__cxx11::string::append((char *)&local_3f8);
      pAVar7 = &local_380;
      if ((bool)local_2e8[0x23] == false) {
        pAVar7 = (AnnotationCollector *)0x0;
      }
      io::Printer::Printer(&local_370,pZVar5,'$',pAVar7);
      paVar1 = &local_3c0.field_2;
      local_3c0._M_dataplus._M_p = (pointer)paVar1;
      if ((bool)local_2e8[0x23] == true) {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3c0,local_3f8,local_3f0 + (long)local_3f8);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"");
      }
      FileGenerator::GenerateProtoHeader((FileGenerator *)local_238,&local_370,&local_3c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
      }
      if ((bool)local_2e8[0x23] == true) {
        iVar3 = (*pGVar2->_vptr_GeneratorContext[2])(pGVar2,&local_3f8);
        pZVar6 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar3);
        MessageLite::SerializeToZeroCopyStream((MessageLite *)&local_268,pZVar6);
        if (pZVar6 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar6->_vptr_ZeroCopyOutputStream[1])(pZVar6);
        }
      }
      io::Printer::~Printer(&local_370);
      if (local_3f8 != local_3e8) {
        operator_delete(local_3f8,local_3e8[0] + 1);
      }
      GeneratedCodeInfo::~GeneratedCodeInfo(&local_268);
      if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
      }
    }
    std::__cxx11::string::append((char *)&local_3a0);
    local_370._0_8_ = lVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_370,local_3a0._M_dataplus._M_p,
               local_3a0._M_dataplus._M_p + local_3a0._M_string_length);
    std::__cxx11::string::append(&local_370.variable_delimiter_);
    iVar3 = (*pGVar2->_vptr_GeneratorContext[2])(pGVar2,&local_370);
    pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar3);
    if (local_370._0_8_ != lVar10) {
      operator_delete((void *)local_370._0_8_,(ulong)(local_370.buffer_ + 1));
    }
    GeneratedCodeInfo::GeneratedCodeInfo(&local_268);
    local_380._vptr_AnnotationCollector = (_func_int **)&PTR_AddAnnotation_0041ee28;
    local_3f8 = local_3e8;
    local_378 = &local_268;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3f8,local_3a0._M_dataplus._M_p,
               local_3a0._M_dataplus._M_p + local_3a0._M_string_length);
    std::__cxx11::string::append((char *)&local_3f8);
    pAVar7 = &local_380;
    if ((bool)local_2e8[0x23] == false) {
      pAVar7 = (AnnotationCollector *)0x0;
    }
    io::Printer::Printer(&local_370,pZVar5,'$',pAVar7);
    paVar1 = &local_3c0.field_2;
    local_3c0._M_dataplus._M_p = (pointer)paVar1;
    if ((bool)local_2e8[0x23] == true) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_3c0,local_3f8,local_3f0 + (long)local_3f8);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"");
    }
    FileGenerator::GeneratePBHeader((FileGenerator *)local_238,&local_370,&local_3c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    if ((bool)local_2e8[0x23] == true) {
      iVar3 = (*pGVar2->_vptr_GeneratorContext[2])(pGVar2,&local_3f8);
      pZVar6 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar3);
      MessageLite::SerializeToZeroCopyStream((MessageLite *)&local_268,pZVar6);
      if (pZVar6 != (ZeroCopyOutputStream *)0x0) {
        (*pZVar6->_vptr_ZeroCopyOutputStream[1])(pZVar6);
      }
    }
    io::Printer::~Printer(&local_370);
    if (local_3f8 != local_3e8) {
      operator_delete(local_3f8,local_3e8[0] + 1);
    }
    GeneratedCodeInfo::~GeneratedCodeInfo(&local_268);
    if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
      (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
    }
    local_370._0_8_ = lVar10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_370,local_3a0._M_dataplus._M_p,
               local_3a0._M_dataplus._M_p + local_3a0._M_string_length);
    std::__cxx11::string::append(&local_370.variable_delimiter_);
    iVar3 = (*pGVar2->_vptr_GeneratorContext[2])(pGVar2,&local_370);
    pZVar5 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_03,iVar3);
    if (local_370._0_8_ != lVar10) {
      operator_delete((void *)local_370._0_8_,(ulong)(local_370.buffer_ + 1));
    }
    io::Printer::Printer(&local_370,pZVar5,'$');
    FileGenerator::GenerateSource((FileGenerator *)local_238,&local_370);
    io::Printer::~Printer(&local_370);
    if (pZVar5 != (ZeroCopyOutputStream *)0x0) {
      (*pZVar5->_vptr_ZeroCopyOutputStream[1])(pZVar5);
    }
    FileGenerator::~FileGenerator((FileGenerator *)local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    bVar8 = true;
LAB_0020cd06:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_p != &local_290) {
      operator_delete(local_2a0._M_p,
                      CONCAT71(local_290._M_allocated_capacity._1_7_,local_290._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_p != &local_2b0) {
      operator_delete(local_2c0._M_p,
                      CONCAT71(local_2b0._M_allocated_capacity._1_7_,local_2b0._M_local_buf[0]) + 1)
      ;
    }
    if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
      operator_delete((void *)local_2e8._0_8_,CONCAT71(local_2e8._17_7_,local_2e8[0x10]) + 1);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_3d8);
    return bVar8;
  }
  lVar10 = 0;
  uVar9 = 0;
LAB_0020c72d:
  iVar3 = std::__cxx11::string::compare
                    ((char *)((long)&((local_3d8.
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->first).
                                     _M_dataplus._M_p + lVar10));
  psVar4 = (string *)local_2e8;
  if (iVar3 == 0) goto LAB_0020c7ed;
  iVar3 = std::__cxx11::string::compare
                    ((char *)((long)&((local_3d8.
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->first).
                                     _M_dataplus._M_p + lVar10));
  if (iVar3 == 0) {
    local_2e8[0x20] = true;
  }
  else {
    iVar3 = std::__cxx11::string::compare
                      ((char *)((long)&((local_3d8.
                                         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->first).
                                       _M_dataplus._M_p + lVar10));
    if (iVar3 == 0) {
      local_2e8[0x23] = true;
    }
    else {
      iVar3 = std::__cxx11::string::compare
                        ((char *)((long)&((local_3d8.
                                           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->first).
                                         _M_dataplus._M_p + lVar10));
      if (iVar3 == 0) {
        psVar4 = (string *)&local_2c0;
      }
      else {
        iVar3 = std::__cxx11::string::compare
                          ((char *)((long)&((local_3d8.
                                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->first).
                                           _M_dataplus._M_p + lVar10));
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare
                            ((char *)((long)&((local_3d8.
                                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first).
                                             _M_dataplus._M_p + lVar10));
          if (iVar3 == 0) {
            local_2e8[0x24] = true;
            goto LAB_0020c811;
          }
          iVar3 = std::__cxx11::string::compare
                            ((char *)((long)&((local_3d8.
                                               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->first).
                                             _M_dataplus._M_p + lVar10));
          if (iVar3 != 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_238,"Unknown generator option: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&((local_3d8.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus.
                                   _M_p + lVar10));
            std::__cxx11::string::operator=((string *)local_280,(string *)local_238);
            if ((FileDescriptor *)local_238._0_8_ != (FileDescriptor *)(local_238 + 0x10)) {
              operator_delete((void *)local_238._0_8_,local_228[0]._M_allocated_capacity + 1);
            }
            bVar8 = false;
            goto LAB_0020cd06;
          }
          local_2e8[0x25] = true;
          goto LAB_0020c811;
        }
        psVar4 = (string *)&local_2a0;
      }
LAB_0020c7ed:
      std::__cxx11::string::_M_assign(psVar4);
    }
  }
LAB_0020c811:
  uVar9 = uVar9 + 1;
  lVar10 = lVar10 + 0x40;
  if ((ulong)((long)local_3d8.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_3d8.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6) <= uVar9) goto LAB_0020c852;
  goto LAB_0020c72d;
}

Assistant:

bool CppGenerator::Generate(const FileDescriptor* file,
                            const string& parameter,
                            GeneratorContext* generator_context,
                            string* error) const {
  std::vector<std::pair<string, string> > options;
  ParseGeneratorParameter(parameter, &options);

  // -----------------------------------------------------------------
  // parse generator options

  // TODO(kenton):  If we ever have more options, we may want to create a
  //   class that encapsulates them which we can pass down to all the
  //   generator classes.  Currently we pass dllexport_decl down to all of
  //   them via the constructors, but we don't want to have to add another
  //   constructor parameter for every option.

  // If the dllexport_decl option is passed to the compiler, we need to write
  // it in front of every symbol that should be exported if this .proto is
  // compiled into a Windows DLL.  E.g., if the user invokes the protocol
  // compiler as:
  //   protoc --cpp_out=dllexport_decl=FOO_EXPORT:outdir foo.proto
  // then we'll define classes like this:
  //   class FOO_EXPORT Foo {
  //     ...
  //   }
  // FOO_EXPORT is a macro which should expand to __declspec(dllexport) or
  // __declspec(dllimport) depending on what is being compiled.
  //
  Options file_options;

  for (int i = 0; i < options.size(); i++) {
    if (options[i].first == "dllexport_decl") {
      file_options.dllexport_decl = options[i].second;
    } else if (options[i].first == "safe_boundary_check") {
      file_options.safe_boundary_check = true;
    } else if (options[i].first == "annotate_headers") {
      file_options.annotate_headers = true;
    } else if (options[i].first == "annotation_pragma_name") {
      file_options.annotation_pragma_name = options[i].second;
    } else if (options[i].first == "annotation_guard_name") {
      file_options.annotation_guard_name = options[i].second;
    } else if (options[i].first == "lite") {
      file_options.enforce_lite = true;
    } else if (options[i].first == "table_driven_parsing") {
      file_options.table_driven_parsing = true;
    } else {
      *error = "Unknown generator option: " + options[i].first;
      return false;
    }
  }

  // -----------------------------------------------------------------


  string basename = StripProto(file->name());

  FileGenerator file_generator(file, file_options);

  // Generate header(s).
  if (file_options.proto_h) {
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".proto.h"));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    string info_path = basename + ".proto.h.meta";
    io::Printer printer(output.get(), '$', file_options.annotate_headers
                                               ? &annotation_collector
                                               : NULL);
    file_generator.GenerateProtoHeader(
        &printer, file_options.annotate_headers ? info_path : "");
    if (file_options.annotate_headers) {
      google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> info_output(
          generator_context->Open(info_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }

  basename.append(".pb");
  {
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".h"));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    string info_path = basename + ".h.meta";
    io::Printer printer(output.get(), '$', file_options.annotate_headers
                                               ? &annotation_collector
                                               : NULL);
    file_generator.GeneratePBHeader(
        &printer, file_options.annotate_headers ? info_path : "");
    if (file_options.annotate_headers) {
      google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> info_output(
          generator_context->Open(info_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }

  // Generate cc file.
  {
    google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> output(
        generator_context->Open(basename + ".cc"));
    io::Printer printer(output.get(), '$');
    file_generator.GenerateSource(&printer);
  }

  return true;
}